

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_cleanup_m68k(uc_struct_conflict3 *uc)

{
  int x;
  long lVar1;
  
  if ((uc != (uc_struct_conflict3 *)0x0) && (uc->l1_map != (void **)0x0)) {
    x = uc->v_l2_levels;
    lVar1 = 0;
    if (x < 1) {
      for (; lVar1 < uc->v_l1_size; lVar1 = lVar1 + 1) {
        if (uc->l1_map[lVar1] != (gpointer)0x0) {
          g_free(uc->l1_map[lVar1]);
          uc->l1_map[lVar1] = (void *)0x0;
        }
      }
    }
    else {
      for (; lVar1 < uc->v_l1_size; lVar1 = lVar1 + 1) {
        if ((void **)uc->l1_map[lVar1] != (void **)0x0) {
          tb_clean_internal((void **)uc->l1_map[lVar1],x);
          uc->l1_map[lVar1] = (void *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void tb_cleanup(struct uc_struct *uc)
{
    int i, x;
    void **p;

    if (uc) {
        if (uc->l1_map) {
            x = uc->v_l2_levels;
            if (x <= 0) {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        g_free(p);
                        uc->l1_map[i] = NULL;
                    }
                }
            } else {
                for (i = 0; i < uc->v_l1_size; i++) {
                    p = uc->l1_map[i];
                    if (p) {
                        tb_clean_internal(p, x);
                        uc->l1_map[i] = NULL;
                    }
                }
            }
        }
    }
}